

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O0

int conf_cmp_constkey(void *av,void *bv)

{
  constkey *b;
  key *a;
  void *bv_local;
  void *av_local;
  
  if (*av < *bv) {
    av_local._4_4_ = -1;
  }
  else if (*bv < *av) {
    av_local._4_4_ = 1;
  }
  else if (subkeytypes[*av] == 2) {
    if (*(int *)((long)av + 8) < *(int *)((long)bv + 8)) {
      av_local._4_4_ = -1;
    }
    else if (*(int *)((long)bv + 8) < *(int *)((long)av + 8)) {
      av_local._4_4_ = 1;
    }
    else {
      av_local._4_4_ = 0;
    }
  }
  else if (subkeytypes[*av] == 3) {
    av_local._4_4_ = strcmp(*(char **)((long)av + 8),*(char **)((long)bv + 8));
  }
  else {
    av_local._4_4_ = 0;
  }
  return av_local._4_4_;
}

Assistant:

static int conf_cmp_constkey(void *av, void *bv)
{
    struct key *a = (struct key *)av;
    struct constkey *b = (struct constkey *)bv;

    if (a->primary < b->primary)
        return -1;
    else if (a->primary > b->primary)
        return +1;
    switch (subkeytypes[a->primary]) {
      case TYPE_INT:
        if (a->secondary.i < b->secondary.i)
            return -1;
        else if (a->secondary.i > b->secondary.i)
            return +1;
        return 0;
      case TYPE_STR:
        return strcmp(a->secondary.s, b->secondary.s);
      default:
        return 0;
    }
}